

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCryptoHash.cxx
# Opt level: O0

unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_> cmCryptoHash::New(string_view algo)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  basic_string_view<char,_std::char_traits<char>_> __x_04;
  basic_string_view<char,_std::char_traits<char>_> __x_05;
  basic_string_view<char,_std::char_traits<char>_> __x_06;
  basic_string_view<char,_std::char_traits<char>_> __x_07;
  basic_string_view<char,_std::char_traits<char>_> __x_08;
  bool bVar1;
  char *in_RDX;
  __uniq_ptr_data<cmCryptoHash,_std::default_delete<cmCryptoHash>,_true,_true> this;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_1a8;
  char *local_198;
  char *local_190;
  undefined4 local_184;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_180;
  char *local_170;
  char *local_168;
  undefined4 local_15c;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_158;
  char *local_148;
  char *local_140;
  undefined4 local_134;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_130;
  char *local_120;
  char *local_118;
  undefined4 local_10c;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_108;
  char *local_f8;
  char *local_f0;
  undefined4 local_e4;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_e0;
  char *local_d0;
  char *local_c8;
  undefined4 local_bc;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_b8;
  char *local_a8;
  char *local_a0;
  undefined4 local_94;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_90;
  char *local_80;
  char *local_78;
  undefined4 local_6c;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_68;
  char *local_58;
  char *local_50;
  undefined4 local_44;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_40;
  char *local_30;
  char *local_28;
  char *local_20;
  string_view algo_local;
  
  local_30 = algo._M_str;
  this.super___uniq_ptr_impl<cmCryptoHash,_std::default_delete<cmCryptoHash>_>._M_t.
  super__Tuple_impl<0UL,_cmCryptoHash_*,_std::default_delete<cmCryptoHash>_>.
  super__Head_base<0UL,_cmCryptoHash_*,_false>._M_head_impl =
       (__uniq_ptr_impl<cmCryptoHash,_std::default_delete<cmCryptoHash>_>)algo._M_len;
  local_28 = in_RDX;
  local_20 = local_30;
  algo_local._M_len = (size_t)in_RDX;
  algo_local._M_str =
       (char *)this.super___uniq_ptr_impl<cmCryptoHash,_std::default_delete<cmCryptoHash>_>._M_t.
               super__Tuple_impl<0UL,_cmCryptoHash_*,_std::default_delete<cmCryptoHash>_>.
               super__Head_base<0UL,_cmCryptoHash_*,_false>._M_head_impl;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_40,"MD5");
  __x_08._M_str = local_28;
  __x_08._M_len = (size_t)local_30;
  bVar1 = std::operator==(__x_08,local_40);
  if (bVar1) {
    local_44 = 0;
    std::make_unique<cmCryptoHash,cmCryptoHash::Algo>
              ((Algo *)this.super___uniq_ptr_impl<cmCryptoHash,_std::default_delete<cmCryptoHash>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_cmCryptoHash_*,_std::default_delete<cmCryptoHash>_>.
                       super__Head_base<0UL,_cmCryptoHash_*,_false>._M_head_impl);
  }
  else {
    local_58 = local_20;
    local_50 = (char *)algo_local._M_len;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_68,"SHA1");
    __x_07._M_str = local_50;
    __x_07._M_len = (size_t)local_58;
    bVar1 = std::operator==(__x_07,local_68);
    if (bVar1) {
      local_6c = 1;
      std::make_unique<cmCryptoHash,cmCryptoHash::Algo>
                ((Algo *)this.
                         super___uniq_ptr_impl<cmCryptoHash,_std::default_delete<cmCryptoHash>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_cmCryptoHash_*,_std::default_delete<cmCryptoHash>_>.
                         super__Head_base<0UL,_cmCryptoHash_*,_false>._M_head_impl);
    }
    else {
      local_80 = local_20;
      local_78 = (char *)algo_local._M_len;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_90,"SHA224");
      __x_06._M_str = local_78;
      __x_06._M_len = (size_t)local_80;
      bVar1 = std::operator==(__x_06,local_90);
      if (bVar1) {
        local_94 = 2;
        std::make_unique<cmCryptoHash,cmCryptoHash::Algo>
                  ((Algo *)this.
                           super___uniq_ptr_impl<cmCryptoHash,_std::default_delete<cmCryptoHash>_>.
                           _M_t.
                           super__Tuple_impl<0UL,_cmCryptoHash_*,_std::default_delete<cmCryptoHash>_>
                           .super__Head_base<0UL,_cmCryptoHash_*,_false>._M_head_impl);
      }
      else {
        local_a8 = local_20;
        local_a0 = (char *)algo_local._M_len;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_b8,"SHA256")
        ;
        __x_05._M_str = local_a0;
        __x_05._M_len = (size_t)local_a8;
        bVar1 = std::operator==(__x_05,local_b8);
        if (bVar1) {
          local_bc = 3;
          std::make_unique<cmCryptoHash,cmCryptoHash::Algo>
                    ((Algo *)this.
                             super___uniq_ptr_impl<cmCryptoHash,_std::default_delete<cmCryptoHash>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmCryptoHash_*,_std::default_delete<cmCryptoHash>_>
                             .super__Head_base<0UL,_cmCryptoHash_*,_false>._M_head_impl);
        }
        else {
          local_d0 = local_20;
          local_c8 = (char *)algo_local._M_len;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_e0,"SHA384");
          __x_04._M_str = local_c8;
          __x_04._M_len = (size_t)local_d0;
          bVar1 = std::operator==(__x_04,local_e0);
          if (bVar1) {
            local_e4 = 4;
            std::make_unique<cmCryptoHash,cmCryptoHash::Algo>
                      ((Algo *)this.
                               super___uniq_ptr_impl<cmCryptoHash,_std::default_delete<cmCryptoHash>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmCryptoHash_*,_std::default_delete<cmCryptoHash>_>
                               .super__Head_base<0UL,_cmCryptoHash_*,_false>._M_head_impl);
          }
          else {
            local_f8 = local_20;
            local_f0 = (char *)algo_local._M_len;
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_108,"SHA512");
            __x_03._M_str = local_f0;
            __x_03._M_len = (size_t)local_f8;
            bVar1 = std::operator==(__x_03,local_108);
            if (bVar1) {
              local_10c = 5;
              std::make_unique<cmCryptoHash,cmCryptoHash::Algo>
                        ((Algo *)this.
                                 super___uniq_ptr_impl<cmCryptoHash,_std::default_delete<cmCryptoHash>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_cmCryptoHash_*,_std::default_delete<cmCryptoHash>_>
                                 .super__Head_base<0UL,_cmCryptoHash_*,_false>._M_head_impl);
            }
            else {
              local_120 = local_20;
              local_118 = (char *)algo_local._M_len;
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (&local_130,"SHA3_224");
              __x_02._M_str = local_118;
              __x_02._M_len = (size_t)local_120;
              bVar1 = std::operator==(__x_02,local_130);
              if (bVar1) {
                local_134 = 6;
                std::make_unique<cmCryptoHash,cmCryptoHash::Algo>
                          ((Algo *)this.
                                   super___uniq_ptr_impl<cmCryptoHash,_std::default_delete<cmCryptoHash>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_cmCryptoHash_*,_std::default_delete<cmCryptoHash>_>
                                   .super__Head_base<0UL,_cmCryptoHash_*,_false>._M_head_impl);
              }
              else {
                local_148 = local_20;
                local_140 = (char *)algo_local._M_len;
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          (&local_158,"SHA3_256");
                __x_01._M_str = local_140;
                __x_01._M_len = (size_t)local_148;
                bVar1 = std::operator==(__x_01,local_158);
                if (bVar1) {
                  local_15c = 7;
                  std::make_unique<cmCryptoHash,cmCryptoHash::Algo>
                            ((Algo *)this.
                                     super___uniq_ptr_impl<cmCryptoHash,_std::default_delete<cmCryptoHash>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCryptoHash_*,_std::default_delete<cmCryptoHash>_>
                                     .super__Head_base<0UL,_cmCryptoHash_*,_false>._M_head_impl);
                }
                else {
                  local_170 = local_20;
                  local_168 = (char *)algo_local._M_len;
                  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                            (&local_180,"SHA3_384");
                  __x_00._M_str = local_168;
                  __x_00._M_len = (size_t)local_170;
                  bVar1 = std::operator==(__x_00,local_180);
                  if (bVar1) {
                    local_184 = 8;
                    std::make_unique<cmCryptoHash,cmCryptoHash::Algo>
                              ((Algo *)this.
                                       super___uniq_ptr_impl<cmCryptoHash,_std::default_delete<cmCryptoHash>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCryptoHash_*,_std::default_delete<cmCryptoHash>_>
                                       .super__Head_base<0UL,_cmCryptoHash_*,_false>._M_head_impl);
                  }
                  else {
                    local_198 = local_20;
                    local_190 = (char *)algo_local._M_len;
                    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                              (&local_1a8,"SHA3_512");
                    __x._M_str = local_190;
                    __x._M_len = (size_t)local_198;
                    bVar1 = std::operator==(__x,local_1a8);
                    if (bVar1) {
                      std::make_unique<cmCryptoHash,cmCryptoHash::Algo>
                                ((Algo *)this.
                                         super___uniq_ptr_impl<cmCryptoHash,_std::default_delete<cmCryptoHash>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_cmCryptoHash_*,_std::default_delete<cmCryptoHash>_>
                                         .super__Head_base<0UL,_cmCryptoHash_*,_false>._M_head_impl)
                      ;
                    }
                    else {
                      std::unique_ptr<cmCryptoHash,std::default_delete<cmCryptoHash>>::
                      unique_ptr<std::default_delete<cmCryptoHash>,void>
                                ((unique_ptr<cmCryptoHash,std::default_delete<cmCryptoHash>> *)
                                 this.
                                 super___uniq_ptr_impl<cmCryptoHash,_std::default_delete<cmCryptoHash>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_cmCryptoHash_*,_std::default_delete<cmCryptoHash>_>
                                 .super__Head_base<0UL,_cmCryptoHash_*,_false>._M_head_impl,
                                 (nullptr_t)0x0);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return (__uniq_ptr_data<cmCryptoHash,_std::default_delete<cmCryptoHash>,_true,_true>)
         (tuple<cmCryptoHash_*,_std::default_delete<cmCryptoHash>_>)
         this.super___uniq_ptr_impl<cmCryptoHash,_std::default_delete<cmCryptoHash>_>._M_t.
         super__Tuple_impl<0UL,_cmCryptoHash_*,_std::default_delete<cmCryptoHash>_>.
         super__Head_base<0UL,_cmCryptoHash_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<cmCryptoHash> cmCryptoHash::New(cm::string_view algo)
{
  if (algo == "MD5") {
    return cm::make_unique<cmCryptoHash>(AlgoMD5);
  }
  if (algo == "SHA1") {
    return cm::make_unique<cmCryptoHash>(AlgoSHA1);
  }
  if (algo == "SHA224") {
    return cm::make_unique<cmCryptoHash>(AlgoSHA224);
  }
  if (algo == "SHA256") {
    return cm::make_unique<cmCryptoHash>(AlgoSHA256);
  }
  if (algo == "SHA384") {
    return cm::make_unique<cmCryptoHash>(AlgoSHA384);
  }
  if (algo == "SHA512") {
    return cm::make_unique<cmCryptoHash>(AlgoSHA512);
  }
  if (algo == "SHA3_224") {
    return cm::make_unique<cmCryptoHash>(AlgoSHA3_224);
  }
  if (algo == "SHA3_256") {
    return cm::make_unique<cmCryptoHash>(AlgoSHA3_256);
  }
  if (algo == "SHA3_384") {
    return cm::make_unique<cmCryptoHash>(AlgoSHA3_384);
  }
  if (algo == "SHA3_512") {
    return cm::make_unique<cmCryptoHash>(AlgoSHA3_512);
  }
  return std::unique_ptr<cmCryptoHash>(nullptr);
}